

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intContain.c
# Opt level: O3

int Inter_ManCheckInductiveContainment(Aig_Man_t *pTrans,Aig_Man_t *pInter,int nSteps,int fBackward)

{
  int iVar1;
  Aig_Man_t *pNew;
  Cnf_Dat_t *p;
  sat_solver *s;
  uint uVar2;
  long lVar3;
  Aig_Obj_t **ppNewPis;
  Aig_Obj_t **ppNewPis_00;
  long lVar4;
  ulong uVar5;
  Vec_Ptr_t *vMapRegs;
  Vec_Ptr_t *local_38;
  
  iVar1 = pTrans->nRegs;
  lVar4 = (long)iVar1;
  if (lVar4 < 1) {
    __assert_fail("nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/int/intContain.c"
                  ,199,"int Inter_ManCheckInductiveContainment(Aig_Man_t *, Aig_Man_t *, int, int)")
    ;
  }
  uVar5 = (ulong)(uint)nSteps;
  pNew = Inter_ManFramesLatches(pTrans,nSteps,&local_38);
  if (local_38->nSize == iVar1 * (nSteps + 1U)) {
    ppNewPis_00 = (Aig_Obj_t **)local_38->pArray;
    if (fBackward == 0) {
      ppNewPis = ppNewPis_00;
      if (nSteps < 1) {
        nSteps = 0;
      }
      else {
        do {
          Inter_ManAppendCone(pInter,pNew,ppNewPis,0);
          uVar5 = uVar5 - 1;
          ppNewPis = ppNewPis + lVar4;
        } while (uVar5 != 0);
      }
      Inter_ManAppendCone(pInter,pNew,ppNewPis_00 + (uint)(iVar1 * nSteps),1);
    }
    else {
      Inter_ManAppendCone(pInter,pNew,ppNewPis_00,1);
      if (0 < nSteps) {
        lVar3 = (ulong)(nSteps + 1U) - 1;
        do {
          ppNewPis_00 = ppNewPis_00 + lVar4;
          Inter_ManAppendCone(pInter,pNew,ppNewPis_00,0);
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
    }
    if (local_38->pArray != (void **)0x0) {
      free(local_38->pArray);
    }
    free(local_38);
    Aig_ManCleanup(pNew);
    p = Cnf_Derive(pNew,0);
    uVar2 = 1;
    s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
    if (s == (sat_solver *)0x0) {
      Cnf_DataFree(p);
      Aig_ManStop(pNew);
    }
    else {
      iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
      Cnf_DataFree(p);
      Aig_ManStop(pNew);
      sat_solver_delete(s);
      uVar2 = (uint)(iVar1 == -1);
    }
    return uVar2;
  }
  __assert_fail("Vec_PtrSize(vMapRegs) == (nSteps + 1) * nRegs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/int/intContain.c"
                ,0xca,"int Inter_ManCheckInductiveContainment(Aig_Man_t *, Aig_Man_t *, int, int)");
}

Assistant:

int Inter_ManCheckInductiveContainment( Aig_Man_t * pTrans, Aig_Man_t * pInter, int nSteps, int fBackward )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t ** ppNodes;
    Vec_Ptr_t * vMapRegs;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    int f, nRegs, status;
    nRegs = Saig_ManRegNum(pTrans);
    assert( nRegs > 0 );
    // generate the timeframes 
    pFrames = Inter_ManFramesLatches( pTrans, nSteps, &vMapRegs );
    assert( Vec_PtrSize(vMapRegs) == (nSteps + 1) * nRegs );
    // add main constraints to the timeframes
    ppNodes = (Aig_Obj_t **)Vec_PtrArray(vMapRegs);
    if ( !fBackward )
    { 
        // forward inductive check: p -> p -> ... -> !p
        for ( f = 0; f < nSteps; f++ )
            Inter_ManAppendCone( pInter, pFrames, ppNodes + f * nRegs, 0 );
        Inter_ManAppendCone( pInter, pFrames, ppNodes + f * nRegs, 1 );
    }
    else
    {
        // backward inductive check: p -> !p -> ... -> !p
        Inter_ManAppendCone( pInter, pFrames, ppNodes + 0 * nRegs, 1 );
        for ( f = 1; f <= nSteps; f++ )
            Inter_ManAppendCone( pInter, pFrames, ppNodes + f * nRegs, 0 );
    }
    Vec_PtrFree( vMapRegs );
    Aig_ManCleanup( pFrames );

    // convert to CNF
    pCnf = Cnf_Derive( pFrames, 0 ); 
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
//    Cnf_DataFree( pCnf );
//    Aig_ManStop( pFrames );

    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        Aig_ManStop( pFrames );
        return 1;
    }

     // solve the problem
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );

//    Inter_ManCheckUniqueness( pTrans, pSat, pCnf, nSteps );

    Cnf_DataFree( pCnf );
    Aig_ManStop( pFrames );

    sat_solver_delete( pSat );
    return status == l_False;
}